

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopFreezeReliablePdu.cpp
# Opt level: O1

void __thiscall
DIS::StopFreezeReliablePdu::unmarshal(StopFreezeReliablePdu *this,DataStream *dataStream)

{
  SimulationManagementWithReliabilityFamilyPdu::unmarshal
            (&this->super_SimulationManagementWithReliabilityFamilyPdu,dataStream);
  ClockTime::unmarshal(&this->_realWorldTime,dataStream);
  DataStream::operator>>(dataStream,&this->_reason);
  DataStream::operator>>(dataStream,&this->_frozenBehavior);
  DataStream::operator>>(dataStream,&this->_requiredReliablityService);
  DataStream::operator>>(dataStream,&this->_pad1);
  DataStream::operator>>(dataStream,&this->_requestID);
  return;
}

Assistant:

void StopFreezeReliablePdu::unmarshal(DataStream& dataStream)
{
    SimulationManagementWithReliabilityFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _realWorldTime.unmarshal(dataStream);
    dataStream >> _reason;
    dataStream >> _frozenBehavior;
    dataStream >> _requiredReliablityService;
    dataStream >> _pad1;
    dataStream >> _requestID;
}